

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O1

void __thiscall re2c::Dot::emit(Dot *this,OutputFile *o)

{
  uint uVar1;
  Case *pCVar2;
  bool bVar3;
  OutputFile *pOVar4;
  pointer ppVar5;
  ulong uVar6;
  uint32_t i;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = this->cases->cases_size;
  if ((ulong)uVar1 != 0) {
    if (uVar1 == 1) {
      pOVar4 = OutputFile::wlabel(o,(label_t)(this->from->label).value);
      pOVar4 = OutputFile::ws(pOVar4," -> ");
      pOVar4 = OutputFile::wlabel(pOVar4,(label_t)(this->cases->cases->to->label).value);
      OutputFile::ws(pOVar4,"\n");
      return;
    }
    uVar7 = 0;
    do {
      pOVar4 = OutputFile::wlabel(o,(label_t)(this->from->label).value);
      pOVar4 = OutputFile::ws(pOVar4," -> ");
      pOVar4 = OutputFile::wlabel(pOVar4,(label_t)((this->cases->cases[uVar7].to)->label).value);
      OutputFile::ws(pOVar4," [label=\"");
      pCVar2 = this->cases->cases;
      ppVar5 = pCVar2[uVar7].ranges.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pCVar2[uVar7].ranges.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppVar5) {
        uVar6 = 0;
        uVar8 = 1;
        do {
          OutputFile::wrange(o,ppVar5[uVar6].first,ppVar5[uVar6].second);
          pCVar2 = this->cases->cases;
          ppVar5 = pCVar2[uVar7].ranges.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar3 = uVar8 < (ulong)((long)pCVar2[uVar7].ranges.
                                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >>
                                 3);
          uVar6 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar3);
      }
      OutputFile::ws(o,"\"]\n");
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar1);
  }
  return;
}

Assistant:

void Dot::emit (OutputFile & o)
{
	const uint32_t n = cases->cases_size;
	if (n == 1)
	{
		o.wlabel(from->label).ws(" -> ").wlabel(cases->cases[0].to->label).ws("\n");
	}
	else
	{
		for (uint32_t i = 0; i < n; ++i)
		{
			o.wlabel(from->label).ws(" -> ").wlabel(cases->cases[i].to->label).ws(" [label=\"");
			for (uint32_t j = 0; j < cases->cases[i].ranges.size (); ++j)
			{
				o.wrange(cases->cases[i].ranges[j].first, cases->cases[i].ranges[j].second);
			}
			o.ws("\"]\n");
		}
	}
}